

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O1

sexp_conflict sexp_fixnum_to_twos_complement(sexp_conflict ctx,sexp_conflict x,int len)

{
  sexp_conflict psVar1;
  size_t __n;
  long lVar2;
  long lVar3;
  sexp_conflict res;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  
  local_48.var = &local_50;
  local_50 = (sexp_conflict)0x43e;
  local_48.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_48;
  lVar2 = (long)len;
  psVar1 = (sexp_conflict)sexp_make_bignum(ctx,lVar2);
  lVar3 = (long)x >> 1;
  local_50 = psVar1;
  if (1 < len && lVar3 < 0) {
    __n = (ulong)(len - 1) * 8;
    memset((void *)((long)psVar1 + __n + (ulong)(len - 2) * -8 + 0x18),0xff,__n);
  }
  (psVar1->value).type.slots = (sexp)(lVar3 + -1);
  psVar1 = (sexp_conflict)sexp_bignum_fxadd(ctx,psVar1,1);
  if (((psVar1->value).type.cpl == (sexp)(long)(len + 1)) &&
     (*(long *)((long)&psVar1->value + lVar2 * 8 + 0x10) == 1)) {
    *(undefined8 *)((long)&psVar1->value + lVar2 * 8 + 0x10) = 0xffffffffffffffff;
  }
  if (lVar3 < 0) {
    (psVar1->value).flonum_bits[0] = -1;
  }
  (ctx->value).context.saves = local_48.next;
  return psVar1;
}

Assistant:

static sexp sexp_fixnum_to_twos_complement (sexp ctx, sexp x, int len) {
  int i;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_bignum(ctx, len);
  if (sexp_unbox_fixnum(x) < 0)
    for (i = len-1; i > 0; i--)
      sexp_bignum_data(res)[i] = (sexp_uint_t)((sexp_sint_t)-1);
  sexp_bignum_data(res)[0] = ~(-(sexp_unbox_fixnum(x)));
  res = sexp_bignum_fxadd(ctx, res, 1);
  if (sexp_bignum_length(res) == len + 1 && sexp_bignum_data(res)[len] == 1)
    sexp_bignum_data(res)[len] = -1;
  if (sexp_unbox_fixnum(x) < 0)
    sexp_bignum_sign(res) = -1;
  sexp_gc_release1(ctx);
  return res;
}